

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O3

void lm_trie_build(lm_trie_t *trie,ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *out_counts,
                  int order)

{
  ulong uVar1;
  uint32 *puVar2;
  middle_t *pmVar3;
  int *piVar4;
  float32 prob;
  byte bVar5;
  ngram_raw_t *pnVar6;
  unigram_t *puVar7;
  longest_t *plVar8;
  uint8 *puVar9;
  undefined8 uVar10;
  lm_trie_t *plVar11;
  priority_queue_t *ppVar12;
  long *plVar13;
  undefined8 *element;
  middle_t *pmVar14;
  int order_00;
  long lVar15;
  long extraout_RDX;
  middle_t *pmVar16;
  uint uVar17;
  uint32 *puVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  float *pfVar22;
  size_t sVar23;
  ulong uVar24;
  float prob_00;
  bitarr_address_t address;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  bitarr_address_t bVar25;
  uint local_9c;
  ulong local_98;
  float *local_90;
  priority_queue_t *local_88;
  uint *local_80;
  void *local_78;
  uint32 *local_70;
  lm_trie_t *local_68;
  uint32 local_5c;
  ngram_raw_t **local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  lm_trie_fix_counts(raw_ngrams,counts,out_counts,order);
  lm_trie_alloc_ngram(trie,out_counts,order);
  local_98 = (ulong)(uint)order;
  if (1 < order) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x20a,"Training quantizer\n");
    if ((int)local_98 != 2) {
      uVar24 = local_98 & 0xffffffff;
      uVar21 = 2;
      do {
        lm_trie_quant_train(trie->quant,(int)uVar21,counts[uVar21 - 1],raw_ngrams[uVar21 - 2]);
        uVar21 = uVar21 + 1;
      } while (uVar24 != uVar21);
    }
  }
  iVar19 = (int)local_98;
  sVar23 = (size_t)iVar19;
  local_58 = raw_ngrams;
  lm_trie_quant_train_prob(trie->quant,iVar19,counts[sVar23 - 1],raw_ngrams[sVar23 - 2]);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x212,"Building LM trie\n");
  local_9c = 0;
  local_5c = *counts;
  local_70 = counts;
  ppVar12 = priority_queue_create(sVar23,ngram_ord_comparator);
  local_80 = (uint *)__ckd_calloc__(sVar23,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                    ,0x107);
  uVar17 = iVar19 - 1;
  local_90 = (float *)__ckd_calloc__((long)(int)uVar17,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                     ,0x108);
  plVar13 = (long *)__ckd_calloc__(1,0x18,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                   ,0x109);
  *(undefined4 *)(plVar13 + 2) = 1;
  *plVar13 = (long)&local_9c;
  local_88 = ppVar12;
  priority_queue_add(ppVar12,plVar13);
  local_78 = __ckd_calloc__((long)(int)uVar17,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                            ,0x10e);
  if (1 < iVar19) {
    iVar19 = (int)local_98;
    uVar24 = 2;
    do {
      if (local_70[uVar24 - 1] != 0) {
        *(undefined4 *)((long)local_78 + uVar24 * 4 + -8) = 0;
        element = (undefined8 *)
                  __ckd_calloc__(1,0x18,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                 ,0x117);
        pnVar6 = local_58[uVar24 - 2];
        element[2] = *(undefined8 *)&pnVar6->order;
        uVar10 = *(undefined8 *)&pnVar6->prob;
        *element = pnVar6->words;
        element[1] = uVar10;
        *(int *)(element + 2) = (int)uVar24;
        priority_queue_add(local_88,element);
      }
      uVar24 = uVar24 + 1;
    } while (iVar19 + 1 != uVar24);
  }
  local_48 = (ulong)((int)local_98 == 2) * 0x10 + 0x18;
  local_50 = (ulong)uVar17;
  ppVar12 = local_88;
  pfVar22 = local_90;
  local_68 = trie;
  while( true ) {
    while( true ) {
      plVar13 = (long *)priority_queue_poll(ppVar12);
      uVar17 = *(uint *)(plVar13 + 2);
      if (uVar17 == 1) break;
      lVar20 = -0x30;
      uVar24 = 0;
      do {
        plVar11 = local_68;
        pfVar22 = local_90;
        lVar15 = *plVar13;
        local_40 = uVar24;
        local_38 = lVar20;
        if (local_80[uVar24] == *(uint *)(lVar15 + uVar24 * 4)) {
          uVar21 = (ulong)(uVar17 - 1);
        }
        else {
          if (uVar24 == 0) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x131,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)"
                         );
          }
          uVar21 = (ulong)(uVar17 - 1);
          if (uVar24 < uVar21) {
            do {
              uVar1 = uVar24 + 1;
              bVar25 = middle_insert((middle_t *)(&(plVar11->middle_begin->base).word_bits + lVar20)
                                     ,*(uint32 *)(*plVar13 + uVar24 * 4),(int)lVar15,(int)uVar21);
              prob_00 = pfVar22[uVar24 - 1] + plVar11->unigrams[*(uint *)(*plVar13 + uVar24 * 4)].bo
              ;
              pfVar22[uVar24] = prob_00;
              lm_trie_quant_mwrite(plVar11->quant,bVar25,(int)uVar24 + -1,(float32)prob_00,0.0);
              uVar17 = *(uint *)(plVar13 + 2);
              uVar21 = (ulong)(uVar17 - 1);
              lVar20 = lVar20 + 0x30;
              lVar15 = extraout_RDX;
              uVar24 = uVar1;
            } while (uVar1 < uVar21);
          }
        }
        uVar24 = local_40 + 1;
        lVar20 = local_38 + 0x30;
      } while (uVar24 < uVar21);
      memcpy(local_80,(void *)*plVar13,(ulong)uVar17 << 2);
      trie = local_68;
      puVar18 = local_70;
      iVar19 = (int)plVar13[2];
      if (iVar19 == (int)local_98) {
        plVar8 = local_68->longest;
        uVar17 = *(uint *)(*plVar13 + local_50 * 4);
        if ((plVar8->base).word_mask < uVar17) {
          __assert_fail("index <= longest->base.word_mask",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                        ,0x99,"bitarr_address_t longest_insert(longest_t *, uint32)");
        }
        puVar9 = (plVar8->base).base;
        iVar19 = (uint)(plVar8->base).total_bits * (plVar8->base).insert_index;
        bVar25.offset = iVar19;
        bVar25.base = puVar9;
        bVar25._12_4_ = 0;
        bitarr_write_int25(bVar25,(plVar8->base).word_bits,uVar17);
        puVar2 = &(plVar8->base).insert_index;
        *puVar2 = *puVar2 + 1;
        address_01.offset = (uint)(plVar8->base).word_bits + iVar19;
        address_01.base = puVar9;
        address_01._12_4_ = 0;
        lm_trie_quant_lwrite(trie->quant,address_01,*(float32 *)(plVar13 + 1));
      }
      else {
        bVar25 = middle_insert(local_68->middle_begin + (iVar19 - 2),
                               *(uint32 *)(*plVar13 + (ulong)(iVar19 - 1) * 4),order_00,
                               (int)*plVar13);
        prob = *(float32 *)(plVar13 + 1);
        lVar20 = plVar13[2];
        local_90[(int)lVar20 - 1] = (float)prob;
        lm_trie_quant_mwrite
                  (trie->quant,bVar25,(int)lVar20 + -2,prob,*(float32 *)((long)plVar13 + 0xc));
        puVar18 = local_70;
      }
      ppVar12 = local_88;
      piVar4 = (int *)((long)local_78 + (ulong)((int)plVar13[2] - 2) * 4);
      *piVar4 = *piVar4 + 1;
      uVar24 = (ulong)((int)plVar13[2] - 2);
      uVar17 = *(uint *)((long)local_78 + uVar24 * 4);
      if (uVar17 < puVar18[(int)plVar13[2] - 1]) {
        pnVar6 = local_58[uVar24];
        plVar13[2] = *(long *)&pnVar6[uVar17].order;
        pnVar6 = pnVar6 + uVar17;
        lVar20 = *(long *)&pnVar6->prob;
        *plVar13 = (long)pnVar6->words;
        plVar13[1] = lVar20;
        priority_queue_add(local_88,plVar13);
        pfVar22 = local_90;
      }
      else {
        ckd_free(plVar13);
        ppVar12 = local_88;
        pfVar22 = local_90;
      }
    }
    puVar7 = trie->unigrams;
    puVar7[local_9c].next =
         *(uint32 *)(*(long *)((long)trie->backoff_cache + local_48 + -0x38) + 0x10);
    *local_80 = local_9c;
    *pfVar22 = puVar7[local_9c].prob;
    if (local_9c == local_5c) break;
    local_9c = local_9c + 1;
    priority_queue_add(ppVar12,plVar13);
  }
  local_9c = local_9c + 1;
  ckd_free(plVar13);
  sVar23 = priority_queue_size(ppVar12);
  if (sVar23 == 0) {
    priority_queue_free(ppVar12,(_func_void_void_ptr *)0x0);
    ckd_free(local_78);
    ckd_free(local_80);
    ckd_free(pfVar22);
    pmVar14 = trie->middle_begin;
    pmVar16 = trie->middle_end;
    if (pmVar14 != pmVar16) {
      if (pmVar14 != pmVar16 + -1) {
        do {
          pmVar3 = pmVar14 + 1;
          bVar5 = (pmVar14->next_mask).bits;
          address.offset =
               (uint)(pmVar14->base).total_bits * ((pmVar14->base).insert_index + 1) - (uint)bVar5;
          address.base = (pmVar14->base).base;
          address._12_4_ = 0;
          bitarr_write_int25(address,bVar5,pmVar14[1].base.insert_index);
          pmVar16 = trie->middle_end;
          pmVar14 = pmVar3;
        } while (pmVar3 != pmVar16 + -1);
      }
      bVar5 = pmVar16[-1].next_mask.bits;
      address_00.offset =
           (uint)pmVar16[-1].base.total_bits * (pmVar16[-1].base.insert_index + 1) - (uint)bVar5;
      address_00.base = pmVar16[-1].base.base;
      address_00._12_4_ = 0;
      bitarr_write_int25(address_00,bVar5,(trie->longest->base).insert_index);
    }
    return;
  }
  __assert_fail("priority_queue_size(ngrams) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                ,0x160,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
}

Assistant:

void
lm_trie_build(lm_trie_t * trie, ngram_raw_t ** raw_ngrams, uint32 * counts, uint32 *out_counts,
              int order)
{
    int i;

    lm_trie_fix_counts(raw_ngrams, counts, out_counts, order);
    lm_trie_alloc_ngram(trie, out_counts, order);
    
    if (order > 1)
        E_INFO("Training quantizer\n");
    for (i = 2; i < order; i++) {
        lm_trie_quant_train(trie->quant, i, counts[i - 1],
                            raw_ngrams[i - 2]);
    }
    lm_trie_quant_train_prob(trie->quant, order, counts[order - 1],
                             raw_ngrams[order - 2]);

    E_INFO("Building LM trie\n");
    recursive_insert(trie, raw_ngrams, counts, order);
    /* Set ending offsets so the last entry will be sized properly */
    /* Last entry for unigrams was already set. */
    if (trie->middle_begin != trie->middle_end) {
        middle_t *middle_ptr;
        for (middle_ptr = trie->middle_begin;
             middle_ptr != trie->middle_end - 1; ++middle_ptr) {
            middle_t *next_middle_ptr = middle_ptr + 1;
            middle_finish_loading(middle_ptr,
                                  next_middle_ptr->base.insert_index);
        }
        middle_ptr = trie->middle_end - 1;
        middle_finish_loading(middle_ptr,
                              trie->longest->base.insert_index);
    }
}